

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void gimage::rgbToHSV<unsigned_short,gimage::PixelTraits<unsigned_short>>
               (ImageFloat *ret,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  unsigned_short ***pppuVar1;
  float ***pppfVar2;
  long k;
  long lVar3;
  long i;
  long lVar4;
  float val;
  float sat;
  float hue;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,3);
  for (lVar3 = 0; lVar3 < image->height; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 < image->width; lVar4 = lVar4 + 1) {
      pppuVar1 = image->img;
      rgbToHSV<int>(&hue,&sat,&val,(uint)(*pppuVar1)[lVar3][lVar4],(uint)pppuVar1[1][lVar3][lVar4],
                    (uint)pppuVar1[2][lVar3][lVar4],0xffff);
      pppfVar2 = ret->img;
      (*pppfVar2)[lVar3][lVar4] = hue;
      pppfVar2[1][lVar3][lVar4] = sat;
      pppfVar2[2][lVar3][lVar4] = val;
    }
  }
  return;
}

Assistant:

void rgbToHSV(ImageFloat &ret, const Image<T, traits> &image)
{
  float hue, sat, val;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      rgbToHSV(hue, sat, val, image.getW(i, k, 0), image.getW(i, k, 1),
               image.getW(i, k, 2), image.absMaxValue());

      ret.setLimited(i, k, 0, hue);
      ret.setLimited(i, k, 1, sat);
      ret.setLimited(i, k, 2, val);
    }
  }
}